

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O3

double msen(jas_matrix_t *x,jas_matrix_t *y,int n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  lVar1 = x->numrows_;
  lVar2 = x->numcols_;
  if (lVar1 < 1) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      if (0 < lVar2) {
        if (1 < n - 1U) {
          abort();
        }
        lVar3 = 0;
        do {
          dVar6 = (double)(y->rows_[lVar4][lVar3] - x->rows_[lVar4][lVar3]);
          if (n == 1) {
            dVar6 = ABS(dVar6);
          }
          else {
            dVar6 = dVar6 * dVar6;
          }
          dVar5 = dVar5 + dVar6;
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar1);
  }
  return dVar5 / ((double)lVar2 * (double)lVar1);
}

Assistant:

double msen(jas_matrix_t *x, jas_matrix_t *y, int n)
{
	double s;
	double d;

	s = 0.0;
	for (jas_matind_t i = 0; i < jas_matrix_numrows(x); i++) {
		for (jas_matind_t j = 0; j < jas_matrix_numcols(x); j++) {
			d = jas_matrix_get(y, i, j) - jas_matrix_get(x, i, j);
			if (n == 1) {
				s += fabs(d);
			} else if (n == 2) {
				s += d * d;
			} else {
				abort();
			}
		}
	}

	return s / ((double) jas_matrix_numrows(x) * jas_matrix_numcols(x));
}